

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegionChecker.cpp
# Opt level: O0

void __thiscall RegionChecker::printRange(RegionChecker *this,int from,int to)

{
  const_reference cVar1;
  ostream *poVar2;
  void *this_00;
  int in_EDX;
  int in_ESI;
  size_type in_RDI;
  vector<bool,_std::allocator<bool>_> *unaff_retaddr;
  int i;
  int local_14;
  
  local_14 = in_ESI;
  while( true ) {
    if (in_EDX <= local_14) {
      return;
    }
    cVar1 = std::vector<bool,_std::allocator<bool>_>::operator[](unaff_retaddr,in_RDI);
    if (cVar1) break;
    local_14 = local_14 + 1;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"Size: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_EDX - in_ESI);
  poVar2 = std::operator<<(poVar2," Start: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_ESI);
  poVar2 = std::operator<<(poVar2," End: ");
  this_00 = (void *)std::ostream::operator<<(poVar2,in_EDX);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void RegionChecker::printRange(int from, int to) const {
	for (int i = from; i < to; i++) {
		if (fileUsage[i]) {
			goto nonzero;
		}
	}
	return;
nonzero:
	std::cout << "Size: " << (to - from) << " Start: " << from << " End: " << to << std::endl;
}